

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

void __thiscall QFormLayout::setRowVisible(QFormLayout *this,int row,bool on)

{
  QFormLayoutItem *this_00;
  QFormLayoutItem *this_01;
  pointer ppQVar1;
  QList<QFormLayoutItem_*> *this_02;
  bool bVar2;
  
  this_02 = (QList<QFormLayoutItem_*> *)(*(long *)&(this->super_QLayout).field_0x8 + 0xc0);
  ppQVar1 = QList<QFormLayoutItem_*>::data(this_02);
  this_00 = ppQVar1[row * 2];
  ppQVar1 = QList<QFormLayoutItem_*>::data(this_02);
  this_01 = ppQVar1[row * 2 + 1];
  if (this_00 == (QFormLayoutItem *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = this_00->isVisible != on;
    QFormLayoutItem::setVisible(this_00,on);
  }
  if (this_01 != (QFormLayoutItem *)0x0) {
    bVar2 = (bool)(bVar2 | this_01->isVisible != on);
    QFormLayoutItem::setVisible(this_01,on);
  }
  if (bVar2) {
    (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
    return;
  }
  return;
}

Assistant:

void QFormLayout::setRowVisible(int row, bool on)
{
    Q_D(QFormLayout);
    QFormLayoutItem *label = d->m_matrix(row, 0);
    QFormLayoutItem *field = d->m_matrix(row, 1);
    bool change = false;
    if (label) {
        change = label->isVisible != on;
        label->setVisible(on);
    }
    if (field) {
        change |= field->isVisible != on;
        field->setVisible(on);
    }
    if (change)
        invalidate();
}